

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::Renderer::renderStockPileCoveredCards
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex,
          StockPileCollider *collider)

{
  GraphicsSystem *pGVar1;
  int iVar2;
  Position cardPosition;
  int local_38 [3];
  uint local_2c;
  
  local_38[0] = 0x10;
  local_38[1] = 0x1e;
  iVar2 = (*collider->_vptr_StockPileCollider[4])(collider);
  if (0xf < iVar2) {
    do {
      pGVar1 = (this->graphicsSystem)._M_t.
               super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
               .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
               _M_head_impl;
      local_2c = (this->cardsId).t;
      (*pGVar1->_vptr_GraphicsSystem[5])
                (pGVar1,&local_2c,local_38,(anonymous_namespace)::cardBackTextureArea);
      local_38[0] = local_38[0] + 2;
    } while (local_38[0] <= iVar2);
  }
  return;
}

Assistant:

void Renderer::renderStockPileCoveredCards(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex,
    const StockPileCollider& collider) const
{
    auto cardPosition = Layout::stockPilePosition;
    const auto coveredCardsPosition = collider.getCoveredCardsPosition();

    while (cardPosition.x <= coveredCardsPosition.x) {
        renderCardBack(cardPosition);
        cardPosition.x += Layout::stockPileCardsSpacing;
    }
}